

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O0

FT_Error pfr_extra_item_load_kerning_pairs(FT_Byte *p,FT_Byte *limit,PFR_PhyFont phy_font)

{
  uint uVar1;
  FT_Memory memory_00;
  byte *pbVar2;
  FT_Byte *q;
  FT_UInt char2;
  FT_UInt char1;
  FT_Memory memory;
  undefined8 *puStack_28;
  FT_Error error;
  PFR_KernItem_conflict item;
  PFR_PhyFont phy_font_local;
  FT_Byte *limit_local;
  FT_Byte *p_local;
  
  puStack_28 = (undefined8 *)0x0;
  memory._4_4_ = 0;
  memory_00 = phy_font->memory;
  item = (PFR_KernItem_conflict)phy_font;
  phy_font_local = (PFR_PhyFont)limit;
  limit_local = p;
  puStack_28 = (undefined8 *)ft_mem_alloc(memory_00,0x20,(FT_Error *)((long)&memory + 4));
  if (memory._4_4_ == 0) {
    pbVar2 = limit_local;
    if ((PFR_PhyFont)(limit_local + 4) <= phy_font_local) {
      *(FT_Byte *)(puStack_28 + 1) = *limit_local;
      *(ushort *)((long)puStack_28 + 10) = CONCAT11(limit_local[1],limit_local[2]);
      pbVar2 = limit_local + 4;
      *(FT_Byte *)((long)puStack_28 + 9) = limit_local[3];
      uVar1._0_1_ = item->pair_count;
      uVar1._1_1_ = item->flags;
      uVar1._2_2_ = item->base_adj;
      puStack_28[2] = pbVar2 + ((ulong)uVar1 - *(long *)&item[7].pair_count);
      *(undefined4 *)((long)puStack_28 + 0xc) = 3;
      if ((*(byte *)((long)puStack_28 + 9) & 1) != 0) {
        *(int *)((long)puStack_28 + 0xc) = *(int *)((long)puStack_28 + 0xc) + 2;
      }
      if ((*(byte *)((long)puStack_28 + 9) & 2) != 0) {
        *(int *)((long)puStack_28 + 0xc) = *(int *)((long)puStack_28 + 0xc) + 1;
      }
      if ((PFR_PhyFont)(pbVar2 + (uint)*(byte *)(puStack_28 + 1) * *(int *)((long)puStack_28 + 0xc))
          <= phy_font_local) {
        if (*(char *)(puStack_28 + 1) != '\0') {
          if ((*(byte *)((long)puStack_28 + 9) & 1) == 0) {
            *(uint *)(puStack_28 + 3) = (uint)*pbVar2 << 0x10 | (uint)limit_local[5];
            *(uint *)((long)puStack_28 + 0x1c) =
                 (uint)pbVar2[*(int *)((long)puStack_28 + 0xc) * (*(byte *)(puStack_28 + 1) - 1)] <<
                 0x10 | (uint)(pbVar2 + *(int *)((long)puStack_28 + 0xc) *
                                        (*(byte *)(puStack_28 + 1) - 1))[1];
          }
          else {
            *(uint *)(puStack_28 + 3) =
                 CONCAT22(CONCAT11(limit_local[4],limit_local[5]),
                          CONCAT11(limit_local[6],limit_local[7]));
            pbVar2 = pbVar2 + *(int *)((long)puStack_28 + 0xc) * (*(byte *)(puStack_28 + 1) - 1);
            *(uint *)((long)puStack_28 + 0x1c) =
                 CONCAT22(CONCAT11(*pbVar2,pbVar2[1]),CONCAT11(pbVar2[2],pbVar2[3]));
          }
          *puStack_28 = 0;
          **(undefined8 **)&item[6].pair1 = puStack_28;
          *(undefined8 **)&item[6].pair1 = puStack_28;
          *(uint *)&item[6].pair_count =
               (uint)*(byte *)(puStack_28 + 1) + *(int *)&item[6].pair_count;
          return 0;
        }
        limit_local = pbVar2;
        ft_mem_free(memory_00,puStack_28);
        return memory._4_4_;
      }
    }
    limit_local = pbVar2;
    ft_mem_free(memory_00,puStack_28);
    memory._4_4_ = 8;
  }
  return memory._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_extra_item_load_kerning_pairs( FT_Byte*     p,
                                     FT_Byte*     limit,
                                     PFR_PhyFont  phy_font )
  {
    PFR_KernItem  item   = NULL;
    FT_Error      error  = FT_Err_Ok;
    FT_Memory     memory = phy_font->memory;


    if ( FT_NEW( item ) )
      goto Exit;

    PFR_CHECK( 4 );

    item->pair_count = PFR_NEXT_BYTE( p );
    item->base_adj   = PFR_NEXT_SHORT( p );
    item->flags      = PFR_NEXT_BYTE( p );
    item->offset     = phy_font->offset +
                       (FT_Offset)( p - phy_font->cursor );

#ifndef PFR_CONFIG_NO_CHECKS
    item->pair_size = 3;

    if ( item->flags & PFR_KERN_2BYTE_CHAR )
      item->pair_size += 2;

    if ( item->flags & PFR_KERN_2BYTE_ADJ )
      item->pair_size += 1;

    PFR_CHECK( item->pair_count * item->pair_size );
#endif

    /* load first and last pairs into the item to speed up */
    /* lookup later...                                     */
    if ( item->pair_count > 0 )
    {
      FT_UInt   char1, char2;
      FT_Byte*  q;


      if ( item->flags & PFR_KERN_2BYTE_CHAR )
      {
        q     = p;
        char1 = PFR_NEXT_USHORT( q );
        char2 = PFR_NEXT_USHORT( q );

        item->pair1 = PFR_KERN_INDEX( char1, char2 );

        q = p + item->pair_size * ( item->pair_count - 1 );
        char1 = PFR_NEXT_USHORT( q );
        char2 = PFR_NEXT_USHORT( q );

        item->pair2 = PFR_KERN_INDEX( char1, char2 );
      }
      else
      {
        q     = p;
        char1 = PFR_NEXT_BYTE( q );
        char2 = PFR_NEXT_BYTE( q );

        item->pair1 = PFR_KERN_INDEX( char1, char2 );

        q = p + item->pair_size * ( item->pair_count - 1 );
        char1 = PFR_NEXT_BYTE( q );
        char2 = PFR_NEXT_BYTE( q );

        item->pair2 = PFR_KERN_INDEX( char1, char2 );
      }

      /* add new item to the current list */
      item->next                 = NULL;
      *phy_font->kern_items_tail = item;
      phy_font->kern_items_tail  = &item->next;
      phy_font->num_kern_pairs  += item->pair_count;
    }
    else
    {
      /* empty item! */
      FT_FREE( item );
    }

  Exit:
    return error;

  Too_Short:
    FT_FREE( item );

    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_extra_item_load_kerning_pairs:"
               " invalid kerning pairs table\n" ));
    goto Exit;
  }